

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib536.c
# Opt level: O2

int perform(CURLM *multi)

{
  uint __i;
  uint uVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  uint *puVar5;
  char *pcVar6;
  FILE *pFVar7;
  ulong uVar8;
  timeval tVar9;
  timeval older;
  timeval older_00;
  undefined8 uStack_1d0;
  int maxfd;
  int handles;
  timeval interval;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  
  do {
    maxfd = -99;
    interval.tv_sec = 0;
    interval.tv_usec = 100000;
    uVar1 = curl_multi_perform(multi,&handles);
    pFVar7 = _stderr;
    if (uVar1 != 0) {
      uVar8 = (ulong)uVar1;
      uVar4 = curl_multi_strerror(uVar8);
      pcVar6 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
      uStack_1d0 = 0x2d;
LAB_00102835:
      fprintf(pFVar7,pcVar6,
              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib536.c"
              ,uStack_1d0,uVar8,uVar4);
      return (int)uVar8;
    }
    if (handles < 0) {
      pcVar6 = 
      "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n";
      uStack_1d0 = 0x2d;
LAB_00102862:
      fprintf(_stderr,pcVar6,
              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib536.c"
              ,uStack_1d0);
      return 0x7a;
    }
    tVar9 = tutil_tvnow();
    older.tv_usec = tv_test_start.tv_usec;
    older.tv_sec = tv_test_start.tv_sec;
    lVar3 = tutil_tvdiff(tVar9,older);
    if (60000 < lVar3) {
      uStack_1d0 = 0x31;
      goto LAB_00102801;
    }
    if (handles == 0) {
      return 0;
    }
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
      fdread.__fds_bits[lVar3] = 0;
    }
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
      fdwrite.__fds_bits[lVar3] = 0;
    }
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
      fdexcep.__fds_bits[lVar3] = 0;
    }
    uVar1 = curl_multi_fdset(multi,&fdread,&fdwrite,&fdexcep,&maxfd);
    pFVar7 = _stderr;
    if (uVar1 != 0) {
      uVar8 = (ulong)uVar1;
      uVar4 = curl_multi_strerror(uVar8);
      pcVar6 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
      uStack_1d0 = 0x3c;
      goto LAB_00102835;
    }
    if (maxfd < -1) {
      pcVar6 = "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
      uStack_1d0 = 0x3c;
      goto LAB_00102862;
    }
    iVar2 = select_wrapper(maxfd + 1,&fdread,&fdwrite,&fdexcep,&interval);
    if (iVar2 == -1) {
      puVar5 = (uint *)__errno_location();
      pFVar7 = _stderr;
      uVar1 = *puVar5;
      pcVar6 = strerror(uVar1);
      fprintf(pFVar7,"%s:%d select() failed, with errno %d (%s)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib536.c"
              ,0x42,(ulong)uVar1,pcVar6);
      return 0x79;
    }
    tVar9 = tutil_tvnow();
    older_00.tv_usec = tv_test_start.tv_usec;
    older_00.tv_sec = tv_test_start.tv_sec;
    lVar3 = tutil_tvdiff(tVar9,older_00);
  } while (lVar3 < 0xea61);
  uStack_1d0 = 0x46;
LAB_00102801:
  fprintf(_stderr,"%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib536.c"
          ,uStack_1d0);
  return 0x7d;
}

Assistant:

static int perform(CURLM *multi)
{
  int handles;
  fd_set fdread, fdwrite, fdexcep;
  int res = 0;

  for(;;) {
    struct timeval interval;
    int maxfd = -99;

    interval.tv_sec = 0;
    interval.tv_usec = 100000L; /* 100 ms */

    res_multi_perform(multi, &handles);
    if(res)
      return res;

    res_test_timedout();
    if(res)
      return res;

    if(!handles)
      break; /* done */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    res_multi_fdset(multi, &fdread, &fdwrite, &fdexcep, &maxfd);
    if(res)
      return res;

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    res_select_test(maxfd+1, &fdread, &fdwrite, &fdexcep, &interval);
    if(res)
      return res;

    res_test_timedout();
    if(res)
      return res;
  }

  return 0; /* success */
}